

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Merge
               (Image *in1,uint32_t startXIn1,uint32_t startYIn1,Image *in2,uint32_t startXIn2,
               uint32_t startYIn2,Image *in3,uint32_t startXIn3,uint32_t startYIn3,Image *out,
               uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  char *message;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uchar *puVar9;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  ImageTemplate<unsigned_char> *in_stack_00000008;
  uint in_stack_00000010;
  int in_stack_00000018;
  ImageTemplate<unsigned_char> *in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  uint32_t in_stack_00000038;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *in3X;
  uint8_t *in2X;
  uint8_t *in1X;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *in3Y;
  uint8_t *in2Y;
  uint8_t *in1Y;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn3;
  uint32_t rowSizeIn2;
  uint32_t rowSizeIn1;
  uint8_t colorCount;
  ImageTemplate<unsigned_char> *image;
  uint uVar10;
  undefined4 in_stack_fffffffffffffed4;
  uint32_t in_stack_fffffffffffffee4;
  uint32_t in_stack_fffffffffffffeec;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff00;
  ImageTemplate<unsigned_char> *this;
  undefined8 in_stack_ffffffffffffff08;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff10;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff18;
  uchar *puVar11;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff20;
  uchar *puVar12;
  uint32_t in_stack_ffffffffffffff28;
  uchar *puVar13;
  uint32_t in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t in_stack_ffffffffffffff40;
  uchar *local_b8;
  uchar *local_b0;
  
  image = in_stack_00000008;
  uVar10 = in_stack_00000010;
  uVar2 = in_stack_00000038;
  uVar3 = (uint32_t)outXEnd;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff10,(uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20),
             (uint32_t)in_stack_fffffffffffffef8,in_stack_ffffffffffffff20,in_stack_ffffffffffffff28
             ,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,uVar3,in_stack_fffffffffffffee4,
             uVar2);
  this = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffed4,uVar10),image);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffed4,uVar10),image);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11d33c);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x11d349);
  VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_fffffffffffffee4,uVar2));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_stack_00000020);
  if (uVar1 != '\x03') {
    message = (char *)__cxa_allocate_exception(0x28);
    imageException::imageException((imageException *)this,message);
    __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
  }
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RCX);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_stack_00000008);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_stack_00000020);
  local_b0 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  local_b0 = local_b0 + (ulong)in_ESI + (ulong)(in_EDX * uVar2);
  local_b8 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RCX);
  local_b8 = local_b8 + (ulong)in_R8D + (ulong)(in_R9D * uVar3);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_stack_00000008);
  puVar6 = puVar6 + (ulong)in_stack_00000010 + (ulong)(in_stack_00000018 * uVar4);
  puVar7 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_stack_00000020);
  puVar7 = puVar7 + (ulong)(uint)(in_stack_00000028 * 3) + (ulong)(in_stack_00000030 * uVar5);
  puVar8 = puVar7 + (uint32_t)outXEnd * uVar5;
  for (; puVar7 != puVar8; puVar7 = puVar7 + uVar5) {
    puVar11 = puVar6;
    puVar12 = local_b8;
    puVar13 = local_b0;
    for (puVar9 = puVar7; puVar9 != puVar7 + in_stack_00000038 * 3; puVar9 = puVar9 + 3) {
      *puVar9 = *puVar13;
      puVar9[1] = *puVar12;
      puVar9[2] = *puVar11;
      puVar11 = puVar11 + 1;
      puVar12 = puVar12 + 1;
      puVar13 = puVar13 + 1;
    }
    local_b0 = local_b0 + uVar2;
    local_b8 = local_b8 + uVar3;
    puVar6 = puVar6 + uVar4;
  }
  return;
}

Assistant:

void Merge( const Image & in1, uint32_t startXIn1, uint32_t startYIn1, const Image & in2, uint32_t startXIn2, uint32_t startYIn2,
                const Image & in3, uint32_t startXIn3, uint32_t startYIn3, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height )
    {
        ParameterValidation ( in1, startXIn1, startYIn1, in2, startXIn2, startYIn2, in3, startXIn3, startYIn3, width, height );
        ParameterValidation ( out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in1, in2, in3 );
        VerifyRGBImage      ( out );

        const uint8_t colorCount = RGB;

        if( colorCount != out.colorCount() )
            throw imageException( "Color image is not 3-colored image" );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeIn3 = in3.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        width = width * colorCount;

        const uint8_t * in1Y = in1.data() + startYIn1 * rowSizeIn1 + startXIn1;
        const uint8_t * in2Y = in2.data() + startYIn2 * rowSizeIn2 + startXIn2;
        const uint8_t * in3Y = in3.data() + startYIn3 * rowSizeIn3 + startXIn3;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2, in3Y += rowSizeIn3 ) {
            const uint8_t * in1X = in1Y;
            const uint8_t * in2X = in2Y;
            const uint8_t * in3X = in3Y;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ) {
                *(outX++) = *(in1X++);
                *(outX++) = *(in2X++);
                *(outX++) = *(in3X++);
            }
        }
    }